

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

int __thiscall
cmGlobalGenerator::TryCompile
          (cmGlobalGenerator *this,int jobs,string *srcdir,string *bindir,string *projectName,
          string *target,bool fast,string *output,cmMakefile *mf)

{
  cmState *this_00;
  cmake *this_01;
  int iVar1;
  cmValue cVar2;
  string *psVar3;
  float fVar4;
  float fVar5;
  allocator<char> local_241;
  cmBuildOptions defaultBuildOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string local_218;
  string config;
  string local_1d8;
  stringstream ostr;
  ostream local_1a8;
  
  this_00 = (this->CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ostr,"CMAKE_NUMBER_OF_MAKEFILES",(allocator<char> *)&config);
  cVar2 = cmState::GetInitializedCacheValue(this_00,(string *)&ostr);
  std::__cxx11::string::~string((string *)&ostr);
  if (cVar2.Value == (string *)0x0) {
    fVar5 = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    fVar4 = 0.95;
    if (fVar5 <= 0.95) {
      fVar4 = fVar5;
    }
    this->FirstTimeProgress = fVar4;
    this_01 = this->CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ostr,"Configuring",(allocator<char> *)&config);
    cmake::UpdateProgress(this_01,(string *)&ostr,this->FirstTimeProgress);
    std::__cxx11::string::~string((string *)&ostr);
  }
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (target->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&ostr,(string *)target);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,&ostr
               ,&local_1a8.field_0x10);
    std::__cxx11::string::~string((string *)&ostr);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ostr,"CMAKE_TRY_COMPILE_CONFIGURATION",(allocator<char> *)&local_218);
  psVar3 = cmMakefile::GetSafeDefinition(mf,(string *)&ostr);
  std::__cxx11::string::string((string *)&config,(string *)psVar3);
  std::__cxx11::string::~string((string *)&ostr);
  defaultBuildOptions.Clean = false;
  defaultBuildOptions.Fast = fast;
  defaultBuildOptions.ResolveMode = Disable;
  std::__cxx11::stringstream::stringstream((stringstream *)&ostr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"",&local_241);
  local_1d8._M_dataplus._M_p = (pointer)0x0;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  iVar1 = Build(this,jobs,&local_1d8,bindir,projectName,&local_238,&local_1a8,&local_218,&config,
                &defaultBuildOptions,true,(cmDuration)(this->TryCompileTimeout).__r,OUTPUT_NONE,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)output,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ostr);
  std::__cxx11::string::~string((string *)&config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  return iVar1;
}

Assistant:

int cmGlobalGenerator::TryCompile(int jobs, const std::string& srcdir,
                                  const std::string& bindir,
                                  const std::string& projectName,
                                  const std::string& target, bool fast,
                                  std::string& output, cmMakefile* mf)
{
  // if this is not set, then this is a first time configure
  // and there is a good chance that the try compile stuff will
  // take the bulk of the time, so try and guess some progress
  // by getting closer and closer to 100 without actually getting there.
  if (!this->CMakeInstance->GetState()->GetInitializedCacheValue(
        "CMAKE_NUMBER_OF_MAKEFILES")) {
    // If CMAKE_NUMBER_OF_MAKEFILES is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move 1/10th of the way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) / 30.0f);
    if (this->FirstTimeProgress > 0.95f) {
      this->FirstTimeProgress = 0.95f;
    }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
  }

  std::vector<std::string> newTarget = {};
  if (!target.empty()) {
    newTarget = { target };
  }
  std::string config =
    mf->GetSafeDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
  cmBuildOptions defaultBuildOptions(false, fast, PackageResolveMode::Disable);

  std::stringstream ostr;
  auto ret =
    this->Build(jobs, srcdir, bindir, projectName, newTarget, ostr, "", config,
                defaultBuildOptions, true, this->TryCompileTimeout);
  output = ostr.str();
  return ret;
}